

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O0

bool QFile::moveToTrash(QString *fileName,QString *pathInTrash)

{
  long lVar1;
  bool bVar2;
  long in_RSI;
  long in_FS_OFFSET;
  QFile file;
  QString *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  QFile *this;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  QFile *in_stack_ffffffffffffffb0;
  bool local_31;
  QFile *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFile *)&DAT_aaaaaaaaaaaaaaaa;
  this = (QFile *)&stack0xffffffffffffffe8;
  QFile(in_stack_ffffffffffffffb0,
        (QString *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  bVar2 = moveToTrash(this_00);
  if (bVar2) {
    if (in_RSI != 0) {
      QFile::fileName(this);
      QString::operator=((QString *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff88);
      QString::~QString((QString *)0x2a366c);
    }
    local_31 = true;
  }
  else {
    local_31 = false;
  }
  ~QFile((QFile *)0x2a36b2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_31;
  }
  __stack_chk_fail();
}

Assistant:

bool
QFile::moveToTrash(const QString &fileName, QString *pathInTrash)
{
    QFile file(fileName);
    if (file.moveToTrash()) {
        if (pathInTrash)
            *pathInTrash = file.fileName();
        return true;
    }
    return false;
}